

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

pattern * idItem(void)

{
  char cVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  uint val;
  ushort **ppuVar4;
  pattern *ppVar5;
  byte bVar6;
  ulong uVar7;
  char *s;
  byte *pbVar8;
  char msg [200];
  
  __s1 = SymTable[tokenval].lexptr;
  iVar2 = strncmp(__s1,"FILE",4);
  if ((iVar2 == 0) &&
     (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)__s1[4] * 2 + 1) & 8) != 0)) {
    val = parseInteger(__s1,4,10);
    iVar2 = 0x130;
    goto LAB_00124172;
  }
  iVar2 = strncmp(__s1,"CHAIN",5);
  if (iVar2 == 0) {
    ppuVar4 = __ctype_b_loc();
    uVar7 = (ulong)__s1[5];
    if ((uVar7 == 0x5f) || (((*ppuVar4)[uVar7] & 8) != 0)) {
      s = __s1 + 5;
      pbVar8 = (byte *)(__s1 + 6);
      do {
        if ((char)uVar7 == '_') {
          pbVar8[-1] = 0x20;
        }
        else if ((uVar7 & 0xff) == 0) goto LAB_0012407d;
        uVar7 = (ulong)*pbVar8;
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
  }
  cVar1 = *__s1;
  if (((cVar1 == 'A') && (__s1[1] == 'L')) && (__s1[2] == 'T')) {
    ppuVar4 = __ctype_b_loc();
    bVar6 = __s1[3];
    if (((long)(char)bVar6 == 0x5f) || (((*ppuVar4)[(char)bVar6] & 8) != 0)) {
      if (bVar6 == 0x5f) {
        __s1[3] = ' ';
        bVar6 = 0x20;
      }
      val = (uint)bVar6;
      iVar2 = 0x133;
      goto LAB_00124172;
    }
  }
  iVar2 = strncmp(__s1,"MODEL",5);
  if ((iVar2 == 0) &&
     (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)__s1[5] * 2 + 1) & 8) != 0)) {
    val = parseInteger(__s1,5,10);
    iVar2 = 0x131;
    goto LAB_00124172;
  }
  iVar2 = strncmp(__s1,"ATOM",4);
  if (iVar2 == 0) {
    ppuVar4 = __ctype_b_loc();
    uVar7 = (ulong)__s1[4];
    if ((uVar7 == 0x5f) || (((*ppuVar4)[uVar7] & 8) != 0)) {
      s = __s1 + 4;
      pbVar8 = (byte *)(__s1 + 5);
      do {
        if ((char)uVar7 == '_') {
          pbVar8[-1] = 0x20;
        }
        else if ((uVar7 & 0xff) == 0) goto LAB_001240dd;
        uVar7 = (ulong)*pbVar8;
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
  }
  if (((cVar1 == 'S') && (__s1[1] == 'E')) && (__s1[2] == 'G')) {
    ppuVar4 = __ctype_b_loc();
    uVar7 = (ulong)__s1[3];
    if ((uVar7 == 0x5f) || (((*ppuVar4)[uVar7] & 8) != 0)) {
      s = __s1 + 3;
      pbVar8 = (byte *)(__s1 + 4);
      do {
        if ((char)uVar7 == '_') {
          pbVar8[-1] = 0x20;
        }
        else if ((uVar7 & 0xff) == 0) goto LAB_00124152;
        uVar7 = (ulong)*pbVar8;
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
  }
  iVar2 = strcmp(__s1,"ALL");
  val = 0;
  if (iVar2 == 0) {
    iVar2 = 0x136;
    goto LAB_00124172;
  }
  iVar3 = strcmp(__s1,"NONE");
  iVar2 = 0x137;
  if (iVar3 == 0) goto LAB_00124172;
  iVar3 = strcmp(__s1,"ALPHA");
  if (iVar3 == 0) {
    val = 4;
  }
  else {
    iVar3 = strcmp(__s1,"BETA");
    if (iVar3 == 0) {
      val = 8;
    }
    else {
      iVar3 = strcmp(__s1,"MAINCHAIN");
      val = 1;
      if ((iVar3 != 0) &&
         ((((cVar1 != 'M' || (__s1[1] != 'C')) || (__s1[2] != '\0')) &&
          (iVar3 = strcmp(__s1,"BACKBONE"), iVar3 != 0)))) {
        iVar3 = strcmp(__s1,"SIDECHAIN");
        val = 2;
        if ((iVar3 != 0) &&
           ((((cVar1 != 'S' || (__s1[1] != 'C')) || (__s1[2] != '\0')) &&
            (iVar3 = strcmp(__s1,"BASE"), iVar3 != 0)))) {
          iVar3 = strcmp(__s1,"NITROGEN");
          if (iVar3 == 0) {
            val = 0x10;
          }
          else {
            iVar3 = strcmp(__s1,"CARBON");
            if (iVar3 == 0) {
              val = 0x20;
            }
            else {
              iVar3 = strcmp(__s1,"OXYGEN");
              if (iVar3 == 0) {
                val = 0x40;
              }
              else {
                iVar3 = strcmp(__s1,"SULFUR");
                if (iVar3 == 0) {
                  val = 0x80;
                }
                else {
                  iVar3 = strcmp(__s1,"PHOSPHORUS");
                  if (iVar3 == 0) {
                    val = 0x100;
                  }
                  else {
                    iVar3 = strcmp(__s1,"HYDROGEN");
                    if (iVar3 == 0) {
                      val = 0x200;
                    }
                    else {
                      iVar3 = strcmp(__s1,"H2O");
                      val = 0x400;
                      if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"WATER"), iVar3 != 0)) {
                        iVar3 = strcmp(__s1,"HET");
                        val = 0x800;
                        if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"HETATM"), iVar3 != 0)) {
                          iVar3 = strcmp(__s1,"PROTEIN");
                          val = 0x1000;
                          if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"PEPTIDE"), iVar3 != 0)) {
                            iVar3 = strcmp(__s1,"DNA");
                            val = 0x2000;
                            if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"RNA"), iVar3 != 0)) {
                              iVar3 = strcmp(__s1,"METAL");
                              if (iVar3 == 0) {
                                val = 0x4000;
                              }
                              else {
                                iVar3 = strcmp(__s1,"METHYLENE");
                                if (iVar3 == 0) {
                                  val = 0x40000000;
                                }
                                else {
                                  iVar3 = strcmp(__s1,"METHYL");
                                  if (iVar3 == 0) {
                                    val = 0x8000;
                                  }
                                  else {
                                    iVar3 = strcmp(__s1,"DONOR");
                                    if (iVar3 == 0) {
                                      val = 0x10000;
                                    }
                                    else {
                                      iVar3 = strcmp(__s1,"ACCEPTOR");
                                      if (iVar3 == 0) {
                                        val = 0x20000;
                                      }
                                      else {
                                        iVar3 = strcmp(__s1,"NONPOLAR");
                                        val = 0x800000;
                                        if ((((iVar3 != 0) &&
                                             (iVar3 = strcmp(__s1,"HYDROPHOBIC"), iVar3 != 0)) &&
                                            (iVar3 = strcmp(__s1,"HPHOBIC"), iVar3 != 0)) &&
                                           (iVar3 = strcmp(__s1,"PHOBIC"), iVar3 != 0)) {
                                          iVar3 = strcmp(__s1,"POLAR");
                                          val = 0x1000000;
                                          if (((iVar3 != 0) &&
                                              (iVar3 = strcmp(__s1,"HYDROPHILIC"), iVar3 != 0)) &&
                                             ((iVar3 = strcmp(__s1,"HPHILIC"), iVar3 != 0 &&
                                              (iVar3 = strcmp(__s1,"PHILIC"), iVar3 != 0)))) {
                                            iVar3 = strcmp(__s1,"CHARGED");
                                            val = 0x2000000;
                                            if ((iVar3 != 0) &&
                                               (iVar3 = strcmp(__s1,"CHARGE"), iVar3 != 0)) {
                                              iVar3 = strcmp(__s1,"AROMATIC");
                                              if (iVar3 != 0) {
                                                iVar3 = strcmp(__s1,"GLY");
                                                if ((iVar3 == 0) ||
                                                   ((cVar1 == 'G' && (__s1[1] == '\0')))) {
                                                  val = lookup("GLY");
                                                  iVar2 = 0x135;
                                                  if (val != 0) goto LAB_00124172;
                                                  s = "GLY";
                                                  iVar3 = 0x135;
                                                }
                                                else {
                                                  iVar3 = strcmp(__s1,"ALA");
                                                  if ((iVar3 == 0) ||
                                                     ((cVar1 == 'A' && (__s1[1] == '\0')))) {
                                                    val = lookup("ALA");
                                                    iVar2 = 0x135;
                                                    if (val != 0) goto LAB_00124172;
                                                    s = "ALA";
                                                    iVar3 = 0x135;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(__s1,"VAL");
                                                    if ((iVar3 == 0) ||
                                                       ((cVar1 == 'V' && (__s1[1] == '\0')))) {
                                                      val = lookup("VAL");
                                                      iVar2 = 0x135;
                                                      if (val != 0) goto LAB_00124172;
                                                      s = "VAL";
                                                      iVar3 = 0x135;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(__s1,"PHE");
                                                      if ((iVar3 == 0) ||
                                                         ((cVar1 == 'F' && (__s1[1] == '\0')))) {
                                                        val = lookup("PHE");
                                                        iVar2 = 0x135;
                                                        if (val != 0) goto LAB_00124172;
                                                        s = "PHE";
                                                        iVar3 = 0x135;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(__s1,"PRO");
                                                        if ((iVar3 == 0) ||
                                                           ((cVar1 == 'P' && (__s1[1] == '\0')))) {
                                                          val = lookup("PRO");
                                                          iVar2 = 0x135;
                                                          if (val != 0) goto LAB_00124172;
                                                          s = "PRO";
                                                          iVar3 = 0x135;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(__s1,"MET");
                                                          if ((iVar3 == 0) ||
                                                             ((cVar1 == 'M' && (__s1[1] == '\0'))))
                                                          {
                                                            val = lookup("MET");
                                                            iVar2 = 0x135;
                                                            if (val != 0) goto LAB_00124172;
                                                            s = "MET";
                                                            iVar3 = 0x135;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(__s1,"ILE");
                                                            if ((iVar3 == 0) ||
                                                               ((cVar1 == 'I' && (__s1[1] == '\0')))
                                                               ) {
                                                              val = lookup("ILE");
                                                              iVar2 = 0x135;
                                                              if (val != 0) goto LAB_00124172;
                                                              s = "ILE";
                                                              iVar3 = 0x135;
                                                            }
                                                            else {
                                                              iVar3 = strcmp(__s1,"LEU");
                                                              if ((iVar3 == 0) ||
                                                                 ((cVar1 == 'L' && (__s1[1] == '\0')
                                                                  ))) {
                                                                val = lookup("LEU");
                                                                iVar2 = 0x135;
                                                                if (val != 0) goto LAB_00124172;
                                                                s = "LEU";
                                                                iVar3 = 0x135;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(__s1,"ASP");
                                                                if ((iVar3 == 0) ||
                                                                   ((cVar1 == 'D' &&
                                                                    (__s1[1] == '\0')))) {
                                                                  val = lookup("ASP");
                                                                  iVar2 = 0x135;
                                                                  if (val != 0) goto LAB_00124172;
                                                                  s = "ASP";
                                                                  iVar3 = 0x135;
                                                                }
                                                                else {
                                                                  iVar3 = strcmp(__s1,"GLU");
                                                                  if ((iVar3 == 0) ||
                                                                     ((cVar1 == 'E' &&
                                                                      (__s1[1] == '\0')))) {
                                                                    val = lookup("GLU");
                                                                    iVar2 = 0x135;
                                                                    if (val != 0) goto LAB_00124172;
                                                                    s = "GLU";
                                                                    iVar3 = 0x135;
                                                                  }
                                                                  else {
                                                                    iVar3 = strcmp(__s1,"LYS");
                                                                    if ((iVar3 == 0) ||
                                                                       ((cVar1 == 'K' &&
                                                                        (__s1[1] == '\0')))) {
                                                                      val = lookup("LYS");
                                                                      iVar2 = 0x135;
                                                                      if (val != 0)
                                                                      goto LAB_00124172;
                                                                      s = "LYS";
                                                                      iVar3 = 0x135;
                                                                    }
                                                                    else {
                                                                      iVar3 = strcmp(__s1,"ARG");
                                                                      if ((iVar3 == 0) ||
                                                                         ((cVar1 == 'R' &&
                                                                          (__s1[1] == '\0')))) {
                                                                        val = lookup("ARG");
                                                                        iVar2 = 0x135;
                                                                        if (val != 0)
                                                                        goto LAB_00124172;
                                                                        s = "ARG";
                                                                        iVar3 = 0x135;
                                                                      }
                                                                      else {
                                                                        iVar3 = strcmp(__s1,"SER");
                                                                        if ((iVar3 == 0) ||
                                                                           ((cVar1 == 'S' &&
                                                                            (__s1[1] == '\0')))) {
                                                                          val = lookup("SER");
                                                                          iVar2 = 0x135;
                                                                          if (val != 0)
                                                                          goto LAB_00124172;
                                                                          s = "SER";
                                                                          iVar3 = 0x135;
                                                                        }
                                                                        else {
                                                                          iVar3 = strcmp(__s1,"THR")
                                                                          ;
                                                                          if ((iVar3 == 0) ||
                                                                             ((cVar1 == 'T' &&
                                                                              (__s1[1] == '\0')))) {
                                                                            val = lookup("THR");
                                                                            iVar2 = 0x135;
                                                                            if (val != 0)
                                                                            goto LAB_00124172;
                                                                            s = "THR";
                                                                            iVar3 = 0x135;
                                                                          }
                                                                          else {
                                                                            iVar3 = strcmp(__s1,
                                                  "TYR");
                                                  if ((iVar3 == 0) ||
                                                     ((cVar1 == 'Y' && (__s1[1] == '\0')))) {
                                                    val = lookup("TYR");
                                                    iVar2 = 0x135;
                                                    if (val != 0) goto LAB_00124172;
                                                    s = "TYR";
                                                    iVar3 = 0x135;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(__s1,"HIS");
                                                    if ((iVar3 == 0) ||
                                                       ((cVar1 == 'H' && (__s1[1] == '\0')))) {
                                                      val = lookup("HIS");
                                                      iVar2 = 0x135;
                                                      if (val != 0) goto LAB_00124172;
                                                      s = "HIS";
                                                      iVar3 = 0x135;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(__s1,"CYS");
                                                      if ((iVar3 == 0) ||
                                                         ((cVar1 == 'C' && (__s1[1] == '\0')))) {
                                                        val = lookup("CYS");
                                                        iVar2 = 0x135;
                                                        if (val != 0) goto LAB_00124172;
                                                        s = "CYS";
                                                        iVar3 = 0x135;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(__s1,"ASN");
                                                        if ((iVar3 == 0) ||
                                                           ((cVar1 == 'N' && (__s1[1] == '\0')))) {
                                                          val = lookup("ASN");
                                                          iVar2 = 0x135;
                                                          if (val != 0) goto LAB_00124172;
                                                          s = "ASN";
                                                          iVar3 = 0x135;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(__s1,"GLN");
                                                          if ((iVar3 == 0) ||
                                                             ((cVar1 == 'Q' && (__s1[1] == '\0'))))
                                                          {
                                                            val = lookup("GLN");
                                                            iVar2 = 0x135;
                                                            if (val != 0) goto LAB_00124172;
                                                            s = "GLN";
                                                            iVar3 = 0x135;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(__s1,"TRP");
                                                            if ((iVar3 == 0) ||
                                                               ((cVar1 == 'W' && (__s1[1] == '\0')))
                                                               ) {
                                                              val = lookup("TRP");
                                                              iVar2 = 0x135;
                                                              if (val != 0) goto LAB_00124172;
                                                              s = "TRP";
                                                              iVar3 = 0x135;
                                                            }
                                                            else {
                                                              iVar3 = strcmp(__s1,"ACE");
                                                              if (iVar3 == 0) {
                                                                val = lookup("ACE");
                                                                iVar2 = 0x135;
                                                                if (val != 0) goto LAB_00124172;
                                                                s = "ACE";
                                                                iVar3 = 0x135;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(__s1,"ASX");
                                                                if (iVar3 == 0) {
                                                                  val = lookup("ASX");
                                                                  iVar2 = 0x135;
                                                                  if (val != 0) goto LAB_00124172;
                                                                  s = "ASX";
                                                                  iVar3 = 0x135;
                                                                }
                                                                else {
                                                                  iVar3 = strcmp(__s1,"GLX");
                                                                  if (iVar3 == 0) {
                                                                    val = lookup("GLX");
                                                                    iVar2 = 0x135;
                                                                    if (val != 0) goto LAB_00124172;
                                                                    s = "GLX";
                                                                    iVar3 = 0x135;
                                                                  }
                                                                  else {
                                                                    iVar3 = strcmp(__s1,"MSE");
                                                                    if (iVar3 == 0) {
                                                                      val = lookup("MSE");
                                                                      iVar2 = 0x135;
                                                                      if (val != 0)
                                                                      goto LAB_00124172;
                                                                      s = "MSE";
                                                                      iVar3 = 0x135;
                                                                    }
                                                                    else {
                                                                      iVar3 = strcmp(__s1,"PCA");
                                                                      if (iVar3 == 0) {
                                                                        val = lookup("PCA");
                                                                        iVar2 = 0x135;
                                                                        if (val != 0)
                                                                        goto LAB_00124172;
                                                                        s = "PCA";
                                                                        iVar3 = 0x135;
                                                                      }
                                                                      else {
                                                                        iVar3 = strcmp(__s1,"NH2");
                                                                        if (iVar3 == 0) {
                                                                          val = lookup("NH2");
                                                                          iVar2 = 0x135;
                                                                          if (val != 0)
                                                                          goto LAB_00124172;
                                                                          s = "NH2";
                                                                          iVar3 = 0x135;
                                                                        }
                                                                        else {
                                                                          iVar3 = strcmp(__s1,"NME")
                                                                          ;
                                                                          if (iVar3 == 0) {
                                                                            val = lookup("NME");
                                                                            iVar2 = 0x135;
                                                                            if (val != 0)
                                                                            goto LAB_00124172;
                                                                            s = "NME";
                                                                            iVar3 = 0x135;
                                                                          }
                                                                          else {
                                                                            iVar3 = strcmp(__s1,
                                                  "FOR");
                                                  if (iVar3 != 0) {
                                                    if (cVar1 == 'R') {
                                                      if ((__s1[1] == 'E') && (__s1[2] == 'S')) {
                                                        ppuVar4 = __ctype_b_loc();
                                                        uVar7 = (ulong)__s1[3];
                                                        if ((uVar7 == 0x5f) ||
                                                           (((*ppuVar4)[uVar7] & 8) != 0)) {
                                                          s = __s1 + 3;
                                                          pbVar8 = (byte *)(__s1 + 4);
                                                          do {
                                                            if ((char)uVar7 == '_') {
                                                              pbVar8[-1] = 0x20;
                                                            }
                                                            else if ((uVar7 & 0xff) == 0)
                                                            goto LAB_0012468d;
                                                            uVar7 = (ulong)*pbVar8;
                                                            pbVar8 = pbVar8 + 1;
                                                          } while( true );
                                                        }
                                                      }
                                                    }
                                                    else if (cVar1 == 'B') {
                                                      if (((__s1[1] == 'L') && (__s1[2] == 'T')) &&
                                                         (ppuVar4 = __ctype_b_loc(),
                                                         (*(byte *)((long)*ppuVar4 +
                                                                   (long)__s1[3] * 2 + 1) & 8) != 0)
                                                         ) {
                                                        val = parseInteger(__s1,3,10);
                                                        iVar2 = 0x13c;
                                                        goto LAB_00124172;
                                                      }
                                                      if (((__s1[1] == 'G') && (__s1[2] == 'T')) &&
                                                         (ppuVar4 = __ctype_b_loc(),
                                                         (*(byte *)((long)*ppuVar4 +
                                                                   (long)__s1[3] * 2 + 1) & 8) != 0)
                                                         ) {
                                                        val = parseInteger(__s1,3,10);
                                                        iVar2 = 0x13d;
                                                        goto LAB_00124172;
                                                      }
                                                    }
                                                    else if (cVar1 == 'O') {
                                                      if (((__s1[1] == 'L') && (__s1[2] == 'T')) &&
                                                         (ppuVar4 = __ctype_b_loc(),
                                                         (*(byte *)((long)*ppuVar4 +
                                                                   (long)__s1[3] * 2 + 1) & 8) != 0)
                                                         ) {
                                                        val = parseInteger(__s1,3,10);
                                                        iVar2 = 0x13a;
                                                        goto LAB_00124172;
                                                      }
                                                      if (((__s1[1] == 'G') && (__s1[2] == 'T')) &&
                                                         (ppuVar4 = __ctype_b_loc(),
                                                         (*(byte *)((long)*ppuVar4 +
                                                                   (long)__s1[3] * 2 + 1) & 8) != 0)
                                                         ) {
                                                        val = parseInteger(__s1,3,10);
                                                        iVar2 = 0x13b;
                                                        goto LAB_00124172;
                                                      }
                                                    }
                                                    else if (((cVar1 == 'I') && (__s1[1] == 'N')) &&
                                                            (__s1[2] == 'S')) {
                                                      ppuVar4 = __ctype_b_loc();
                                                      bVar6 = __s1[3];
                                                      if (((long)(char)bVar6 == 0x5f) ||
                                                         (((*ppuVar4)[(char)bVar6] & 8) != 0)) {
                                                        if (bVar6 == 0x5f) {
                                                          __s1[3] = ' ';
                                                          bVar6 = 0x20;
                                                        }
                                                        val = (uint)bVar6;
                                                        iVar2 = 0x140;
                                                        goto LAB_00124172;
                                                      }
                                                    }
                                                    val = 0;
                                                    sprintf(msg,"syntax: unknown identifier: %s",
                                                            __s1);
                                                    errmsg(msg);
                                                    ParseError = 1;
                                                    goto LAB_00124172;
                                                  }
                                                  val = lookup("FOR");
                                                  iVar2 = 0x135;
                                                  if (val != 0) goto LAB_00124172;
                                                  s = "FOR";
                                                  iVar3 = 0x135;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                goto LAB_00124166;
                                              }
                                              val = 0x40000;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar2 = 0x138;
  goto LAB_00124172;
LAB_0012407d:
  if (__s1[6] != '\0') {
    val = lookup(s);
    iVar2 = 0x132;
    goto LAB_0012415f;
  }
  __s1[4] = ' ';
  s = __s1 + 4;
  val = lookup(s);
  iVar2 = 0x132;
  iVar3 = 0x132;
  if (val != 0) goto LAB_00124172;
  goto LAB_00124166;
LAB_001240dd:
  val = lookup(s);
  iVar2 = 0x139;
  goto LAB_0012415f;
LAB_00124152:
  val = lookup(s);
  iVar2 = 0x13f;
  goto LAB_0012415f;
LAB_0012468d:
  val = lookup(s);
  iVar2 = 0x135;
LAB_0012415f:
  iVar3 = iVar2;
  if (val == 0) {
LAB_00124166:
    iVar2 = iVar3;
    val = insert(s,0x193);
  }
LAB_00124172:
  ppVar5 = makeTerminal(iVar2,val);
  matchTok(0x193);
  return ppVar5;
}

Assistant:

pattern* idItem() {
   pattern *lhs = NULL;
   int type = 0, val = 0;
   char *s, *tmpstr;

   s = SymTable[tokenval].lexptr;

   if ((strncmp(s, "FILE", 4) == 0) && isdigit(s[4])) {
      type = FILE_NODE; val = parseInteger(s,4,10);
   }
   else if ((strncmp(s, "CHAIN", 5) == 0) && (isalnum(s[5])||(s[5]=='_'))) {
      type = CHAIN_NODE;
      for(tmpstr = s+5;  *tmpstr; tmpstr++) { /* substitute blank for _ */
         if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      if (s[6] == '\0') { 
         s[4] = ' ';
         val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
      }
      else {
         val = lookup(s+5); if(val == 0) val = insert(s+5, ID_TOK);
      }
     /* type = CHAIN_NODE; val = (unsigned char)s[5]; */
   }
   else if ((strncmp(s, "ALT", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = ALT_NODE; val = (unsigned char)s[3];
   }
   else if ((strncmp(s, "MODEL", 5) == 0) && isdigit(s[5])) {
      type = MODEL_NODE; val = parseInteger(s,5,10);
   }
   else if ((strncmp(s, "ATOM", 4) == 0) && (isalnum(s[4])||(s[4]=='_'))) {
      type = ANAME_NODE;
      for(tmpstr = s+4; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
   }
   else if ((strncmp(s, "SEG", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = SEGID_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if (strcmp(s, "ALL") == 0) {
      type = TRUE_NODE; val = 0;
   }
   else if (strcmp(s, "NONE") == 0) {
      type = FALSE_NODE; val = 0;
   }
   else if (strcmp(s, "ALPHA") == 0) {
      type = PROP_NODE; val = ALPHA_PROP;
   }
   else if (strcmp(s, "BETA") == 0) {
      type = PROP_NODE; val = BETA_PROP;
   }
   else if ((strcmp(s, "MAINCHAIN") == 0) || (strcmp(s, "MC") == 0)
        ||  (strcmp(s, "BACKBONE") == 0)) {
      type = PROP_NODE; val = MC_PROP;
   }
   else if ((strcmp(s, "SIDECHAIN") == 0) || (strcmp(s, "SC") == 0)
        ||  (strcmp(s, "BASE") == 0)) {
      type = PROP_NODE; val = SC_PROP;
   }
   else if (strcmp(s, "NITROGEN") == 0) {
      type = PROP_NODE; val = N_PROP;
   }
   else if (strcmp(s, "CARBON") == 0) {
      type = PROP_NODE; val = C_PROP;
   }
   else if (strcmp(s, "OXYGEN") == 0) {
      type = PROP_NODE; val = O_PROP;
   }
   else if (strcmp(s, "SULFUR") == 0) {
      type = PROP_NODE; val = S_PROP;
   }
   else if (strcmp(s, "PHOSPHORUS") == 0) {
      type = PROP_NODE; val = P_PROP;
   }
   else if (strcmp(s, "HYDROGEN") == 0) {
      type = PROP_NODE; val = H_PROP;
   }
   else if ((strcmp(s, "H2O") == 0) || (strcmp(s, "WATER") == 0)) {
      type = PROP_NODE; val = WATER_PROP;
   }
   else if ((strcmp(s, "HET") == 0) || (strcmp(s, "HETATM") == 0)) {
      type = PROP_NODE; val = HET_PROP;
   }
   else if ((strcmp(s, "PROTEIN") == 0) || (strcmp(s, "PEPTIDE") == 0)) {
      type = PROP_NODE; val = PROT_PROP;
   }
   else if ((strcmp(s, "DNA") == 0) || (strcmp(s, "RNA") == 0)) {
      type = PROP_NODE; val = DNA_PROP;
   }
   else if (strcmp(s, "METAL") == 0) {
      type = PROP_NODE; val = METAL_PROP;
   }
   else if (strcmp(s, "METHYLENE") == 0) {
      type = PROP_NODE; val = METHYLENE_PROP;
   }/*longer name first*/
      else if (strcmp(s, "METHYL") == 0) {
      type = PROP_NODE; val = METHYL_PROP;
   }
   else if (strcmp(s, "DONOR") == 0) {
      type = PROP_NODE; val = DONOR_PROP;
   }
   else if (strcmp(s, "ACCEPTOR") == 0) {
      type = PROP_NODE; val = ACCEPTOR_PROP;
   }
   else if ((strcmp(s, "NONPOLAR") == 0) || (strcmp(s, "HYDROPHOBIC") == 0)
        ||  (strcmp(s, "HPHOBIC")== 0)|| (strcmp(s, "PHOBIC") == 0)) {
      type = PROP_NODE; val = RHPHOBIC_PROP;
   }
   else if ((strcmp(s, "POLAR") == 0) || (strcmp(s, "HYDROPHILIC") == 0)
        ||  (strcmp(s, "HPHILIC")== 0)|| (strcmp(s, "PHILIC") == 0)) {
      type = PROP_NODE; val = RHPHILIC_PROP;
   }
   else if ((strcmp(s, "CHARGED") == 0) || (strcmp(s, "CHARGE") == 0)) {
      type = PROP_NODE; val = RCHARGED_PROP;
   }
   else if (strcmp(s, "AROMATIC") == 0) {
      type = PROP_NODE; val = AROMATIC_PROP;
   }
   else if ((strcmp(s, "GLY") == 0) || (strcmp(s, "G") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLY"); if(val == 0) val = insert("GLY", ID_TOK);
   }
   else if ((strcmp(s, "ALA") == 0) || (strcmp(s, "A") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ALA"); if(val == 0) val = insert("ALA", ID_TOK);
   }
   else if ((strcmp(s, "VAL") == 0) || (strcmp(s, "V") == 0)) {
      type = RTYPE_NODE;
      val = lookup("VAL"); if(val == 0) val = insert("VAL", ID_TOK);
   }
   else if ((strcmp(s, "PHE") == 0) || (strcmp(s, "F") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PHE"); if(val == 0) val = insert("PHE", ID_TOK);
   }
   else if ((strcmp(s, "PRO") == 0) || (strcmp(s, "P") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PRO"); if(val == 0) val = insert("PRO", ID_TOK);
   }
   else if ((strcmp(s, "MET") == 0) || (strcmp(s, "M") == 0)) {
      type = RTYPE_NODE;
      val = lookup("MET"); if(val == 0) val = insert("MET", ID_TOK);
   }
   else if ((strcmp(s, "ILE") == 0) || (strcmp(s, "I") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ILE"); if(val == 0) val = insert("ILE", ID_TOK);
   }
   else if ((strcmp(s, "LEU") == 0) || (strcmp(s, "L") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LEU"); if(val == 0) val = insert("LEU", ID_TOK);
   }
   else if ((strcmp(s, "ASP") == 0) || (strcmp(s, "D") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASP"); if(val == 0) val = insert("ASP", ID_TOK);
   }
   else if ((strcmp(s, "GLU") == 0) || (strcmp(s, "E") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLU"); if(val == 0) val = insert("GLU", ID_TOK);
   }
   else if ((strcmp(s, "LYS") == 0) || (strcmp(s, "K") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LYS"); if(val == 0) val = insert("LYS", ID_TOK);
   }
   else if ((strcmp(s, "ARG") == 0) || (strcmp(s, "R") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ARG"); if(val == 0) val = insert("ARG", ID_TOK);
   }
   else if ((strcmp(s, "SER") == 0) || (strcmp(s, "S") == 0)) {
      type = RTYPE_NODE;
      val = lookup("SER"); if(val == 0) val = insert("SER", ID_TOK);
   }
   else if ((strcmp(s, "THR") == 0) || (strcmp(s, "T") == 0)) {
      type = RTYPE_NODE;
      val = lookup("THR"); if(val == 0) val = insert("THR", ID_TOK);
   }
   else if ((strcmp(s, "TYR") == 0) || (strcmp(s, "Y") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TYR"); if(val == 0) val = insert("TYR", ID_TOK);
   }
   else if ((strcmp(s, "HIS") == 0) || (strcmp(s, "H") == 0)) {
      type = RTYPE_NODE;
      val = lookup("HIS"); if(val == 0) val = insert("HIS", ID_TOK);
   }
   else if ((strcmp(s, "CYS") == 0) || (strcmp(s, "C") == 0)) {
      type = RTYPE_NODE;
      val = lookup("CYS"); if(val == 0) val = insert("CYS", ID_TOK);
   }
   else if ((strcmp(s, "ASN") == 0) || (strcmp(s, "N") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASN"); if(val == 0) val = insert("ASN", ID_TOK);
   }
   else if ((strcmp(s, "GLN") == 0) || (strcmp(s, "Q") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLN"); if(val == 0) val = insert("GLN", ID_TOK);
   }
   else if ((strcmp(s, "TRP") == 0) || (strcmp(s, "W") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TRP"); if(val == 0) val = insert("TRP", ID_TOK);
   }
   else if (strcmp(s, "ACE") == 0) {
      type = RTYPE_NODE;
      val = lookup("ACE"); if(val == 0) val = insert("ACE", ID_TOK);
   }
   else if (strcmp(s, "ASX") == 0) {
      type = RTYPE_NODE;
      val = lookup("ASX"); if(val == 0) val = insert("ASX", ID_TOK);
   }
   else if (strcmp(s, "GLX") == 0) {
      type = RTYPE_NODE;
      val = lookup("GLX"); if(val == 0) val = insert("GLX", ID_TOK);
   }
   else if (strcmp(s, "MSE") == 0) {
      type = RTYPE_NODE;
      val = lookup("MSE"); if(val == 0) val = insert("MSE", ID_TOK);
   }
   else if (strcmp(s, "PCA") == 0) {
      type = RTYPE_NODE;
      val = lookup("PCA"); if(val == 0) val = insert("PCA", ID_TOK);
   }
   else if (strcmp(s, "NH2") == 0) {
      type = RTYPE_NODE;
      val = lookup("NH2"); if(val == 0) val = insert("NH2", ID_TOK);
   }
   else if (strcmp(s, "NME") == 0) {
      type = RTYPE_NODE;
      val = lookup("NME"); if(val == 0) val = insert("NME", ID_TOK);
   }
   else if (strcmp(s, "FOR") == 0) {
      type = RTYPE_NODE;
      val = lookup("FOR"); if(val == 0) val = insert("FOR", ID_TOK);
   }
   else if ((strncmp(s, "RES", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = RTYPE_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if ((strncmp(s, "OLT", 3) == 0) && isdigit(s[3])) {
      type = OCC_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "OGT", 3) == 0) && isdigit(s[3])) {
      type = OCC_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BLT", 3) == 0) && isdigit(s[3])) {
      type = B_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BGT", 3) == 0) && isdigit(s[3])) {
      type = B_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "INS", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = INS_NODE; val = (unsigned char)s[3];
   }
   else {
        char msg[200];
	sprintf(msg,"syntax: unknown identifier: %s", s);
	errmsg(msg);
	ParseError = TRUE;
        type = FALSE_NODE;
        val = 0;
   }

   lhs = makeTerminal(type, val);
   matchTok(ID_TOK);
   return lhs;
}